

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_5.cpp
# Opt level: O0

ostream * operator<<(ostream *os,Date *d)

{
  int iVar1;
  Month MVar2;
  ostream *poVar3;
  Date *d_local;
  ostream *os_local;
  
  poVar3 = std::operator<<(os,'(');
  iVar1 = Date::year(d);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  poVar3 = std::operator<<(poVar3,',');
  MVar2 = Date::month(d);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,MVar2);
  poVar3 = std::operator<<(poVar3,',');
  iVar1 = Date::day(d);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  poVar3 = std::operator<<(poVar3,')');
  return poVar3;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Date& d)
{
	return os << '(' << d.year()
		<< ',' << int(d.month())
		<< ',' << d.day() << ')';
}